

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

char * ssh2_fingerprint_blob(ptrlen blob,FingerprintType fptype)

{
  byte *pbVar1;
  long lVar2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  strbuf *buf_00;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  ptrlen pVar9;
  char buf [5];
  uchar digest [16];
  BinarySource src [1];
  char local_7d [5];
  byte local_78 [16];
  byte abStack_68 [16];
  BinarySource local_58;
  
  buf_00 = strbuf_new();
  local_58.binarysource_ = &local_58;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  local_58.data = blob.ptr;
  local_58.len = blob.len;
  pVar9 = BinarySource_get_string(local_58.binarysource_);
  if ((local_58.binarysource_)->err == BSE_NO_ERROR) {
    lVar8 = 0;
    do {
      lVar2 = *(long *)((long)all_keyalgs + lVar8);
      _Var3 = ptrlen_eq_string(pVar9,*(char **)(lVar2 + 0xa8));
      if (_Var3) {
        uVar4 = (**(code **)(lVar2 + 0x88))(lVar2,blob.ptr,blob.len);
        uVar5 = string_length_for_printf(pVar9.len);
        BinarySink_put_fmt(buf_00->binarysink_,"%.*s %d ",(ulong)uVar5,pVar9.ptr,(ulong)uVar4);
        goto LAB_0011277b;
      }
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x88);
    uVar4 = string_length_for_printf(pVar9.len);
    BinarySink_put_fmt(buf_00->binarysink_,"%.*s ",(ulong)uVar4,pVar9.ptr);
  }
LAB_0011277b:
  if (fptype == SSH_FPTYPE_SHA256) {
    hash_simple(&ssh_sha256,blob,local_78);
    pVar9.len = 7;
    pVar9.ptr = "SHA256:";
    BinarySink_put_datapl(buf_00->binarysink_,pVar9);
    uVar7 = 0xfffffffffffffffd;
    uVar4 = 0x20;
    do {
      uVar5 = 3;
      if (uVar4 < 3) {
        uVar5 = uVar4;
      }
      base64_encode_atom(local_78 + uVar7 + 3,uVar5,local_7d);
      BinarySink_put_data(buf_00->binarysink_,local_7d,4);
      uVar7 = uVar7 + 3;
      uVar4 = uVar4 - 3;
    } while (uVar7 < 0x1d);
    strbuf_chomp(buf_00,'=');
  }
  else if (fptype == SSH_FPTYPE_MD5) {
    hash_simple(&ssh_md5,blob,local_78);
    lVar8 = -0x10;
    do {
      pbVar1 = abStack_68 + lVar8;
      lVar8 = lVar8 + 1;
      pcVar6 = ":";
      if (lVar8 == 0) {
        pcVar6 = "";
      }
      BinarySink_put_fmt(buf_00->binarysink_,"%02x%s",(ulong)*pbVar1,pcVar6);
    } while (lVar8 != 0);
  }
  pcVar6 = strbuf_to_str(buf_00);
  return pcVar6;
}

Assistant:

char *ssh2_fingerprint_blob(ptrlen blob, FingerprintType fptype)
{
    strbuf *sb = strbuf_new();

    /*
     * Identify the key algorithm, if possible.
     *
     * If we can't do that, then we have a seriously confused key
     * blob, in which case we return only the hash.
     */
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, blob);
    ptrlen algname = get_string(src);
    if (!get_err(src)) {
        const ssh_keyalg *alg = find_pubkey_alg_len(algname);
        if (alg) {
            int bits = ssh_key_public_bits(alg, blob);
            put_fmt(sb, "%.*s %d ", PTRLEN_PRINTF(algname), bits);
        } else {
            put_fmt(sb, "%.*s ", PTRLEN_PRINTF(algname));
        }
    }

    switch (fptype) {
      case SSH_FPTYPE_MD5:
        ssh2_fingerprint_blob_md5(blob, sb);
        break;
      case SSH_FPTYPE_SHA256:
        ssh2_fingerprint_blob_sha256(blob, sb);
        break;
    }

    return strbuf_to_str(sb);
}